

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.cpp
# Opt level: O0

uint64_t __thiscall
pstore::exchange::export_ns::string_mapping::add(string_mapping *this,address addr)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long uVar3;
  mapped_type *pmVar4;
  uint64_t index;
  _Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true> local_20;
  string_mapping *local_18;
  string_mapping *this_local;
  address addr_local;
  
  local_18 = this;
  this_local = (string_mapping *)addr.a_;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
       ::find(&this->strings_,(key_type *)&this_local);
  index = (uint64_t)
          std::
          unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
          ::end(&this->strings_);
  bVar1 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true> *)
                     &index);
  if (!bVar1) {
    assert_failed("strings_.find (addr) == strings_.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                  ,0x20);
  }
  sVar2 = std::
          unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
          ::size(&this->strings_);
  uVar3 = std::numeric_limits<unsigned_long>::max();
  if (sVar2 <= uVar3) {
    sVar2 = std::
            unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
            ::size(&this->strings_);
    pmVar4 = std::
             unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
             ::operator[](&this->strings_,(key_type *)&this_local);
    *pmVar4 = sVar2;
    return sVar2;
  }
  assert_failed("strings_.size () <= std::numeric_limits<std::uint64_t>::max ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                ,0x21);
}

Assistant:

std::uint64_t string_mapping::add (address const addr) {
                PSTORE_ASSERT (strings_.find (addr) == strings_.end ());
                PSTORE_ASSERT (strings_.size () <= std::numeric_limits<std::uint64_t>::max ());
                auto const index = static_cast<std::uint64_t> (strings_.size ());
                strings_[addr] = index;
                return index;
            }